

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserDPOMDPFormat_Spirit.h
# Opt level: O2

void __thiscall
DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::NextFloatOfRow::operator()
          (NextFloatOfRow *this,iterator_t *str,iterator_t *end)

{
  pointer pvVar1;
  ostream *poVar2;
  ParserDPOMDPFormat_Spirit *pPVar3;
  double d;
  double local_10;
  
  pPVar3 = this->_m_po;
  if (pPVar3->_m_lp_type != DOUBLE) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "NextFloatOfRow - ERROR parsing probabilities, which");
    poVar2 = std::operator<<(poVar2," means that doubles are expected, however last found");
    poVar2 = std::operator<<(poVar2," type is #");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->_m_po->_m_lp_type);
    std::endl<char,std::char_traits<char>>(poVar2);
    pPVar3 = this->_m_po;
  }
  pvVar1 = (pPVar3->_m_curMatrix).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar1 != (pPVar3->_m_curMatrix).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
    local_10 = pPVar3->_m_lp_double;
    std::vector<double,_std::allocator<double>_>::push_back(pvVar1 + -1,&local_10);
    this->_m_po->_m_matrixModified = true;
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"NextFloatOfRow - ERROR _m_curMatrix contains no ")
  ;
  std::operator<<(poVar2,"elements (i.e. there are no rows to add to...).");
  return;
}

Assistant:

void operator()(iterator_t str, iterator_t end) const
            {
                if(_m_po->_m_lp_type != DOUBLE)
                {
                    std::cout <<"NextFloatOfRow - ERROR parsing probabilities, which"
                        <<" means that doubles are expected, however last found"
                        <<" type is #"<<_m_po->_m_lp_type<<std::endl;
                }
                if(DEBUG_PARSE){//DEBUG
                    Index s =_m_po->_m_curMatrix.size();
                    std::cout <<" _m_po->_m_curMatrix.size()= " << s <<std::endl;
                    if(s>0)
                    std::cout <<" _m_po->_m_curMatrix.back().size()= " <<
                        _m_po->_m_curMatrix.back().size()<<std::endl;
                }
                size_t s =_m_po->_m_curMatrix.size();
                if(s > 0)
                {
                    double d = _m_po->_m_lp_double;
                    //_m_curMatrix.back() isa  vector<double>
                    _m_po->_m_curMatrix.back().push_back(d);
                    _m_po->_m_matrixModified = true;
                }
                else
                    std::cout << "NextFloatOfRow - ERROR _m_curMatrix contains no "<<
                        "elements (i.e. there are no rows to add to...).";

                if(DEBUG_PARSE){//DEBUG
                    size_t s =_m_po->_m_curMatrix.size();
                    std::cout <<" _m_po->_m_curMatrix.size()= " << s <<std::endl;
                    if(s>0)
                    std::cout <<" _m_po->_m_curMatrix.back().size()= " <<
                        _m_po->_m_curMatrix.back().size()<<std::endl;
                }

            }